

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest::verify_ld_r16_d16
          (CpuTest *this,uint8_t instruction,Registers *expected_regs)

{
  undefined2 uVar1;
  bool bVar2;
  MockSpec<unsigned_short_(unsigned_short)> *this_00;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_01;
  pointer pIVar3;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  int local_c0;
  uint local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  Action<unsigned_short_(unsigned_short)> local_98;
  WithoutMatchers local_65 [13];
  Matcher<unsigned_short> local_58;
  MockSpec<unsigned_short_(unsigned_short)> local_40;
  Registers *local_20;
  Registers *expected_regs_local;
  CpuTest *pCStack_10;
  uint8_t instruction_local;
  CpuTest *this_local;
  
  (this->regs).f = 0xf0;
  uVar1 = (this->regs).pc;
  local_20 = expected_regs;
  expected_regs_local._7_1_ = instruction;
  pCStack_10 = this;
  testing::Matcher<unsigned_short>::Matcher(&local_58,uVar1 + 1);
  MockMmu::gmock_read_word(&local_40,&this->mmu,&local_58);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::operator()
                      (&local_40,local_65,(void *)0x0);
  this_01 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0x32,"mmu","read_word(regs.pc + 1)");
  testing::Return<int>((testing *)&gtest_ar.message_,0x3344);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_98,(ReturnAction *)&gtest_ar.message_);
  testing::internal::TypedExpectation<unsigned_short_(unsigned_short)>::WillOnce(this_01,&local_98);
  testing::Action<unsigned_short_(unsigned_short)>::~Action(&local_98);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
  testing::internal::MockSpec<unsigned_short_(unsigned_short)>::~MockSpec(&local_40);
  testing::Matcher<unsigned_short>::~Matcher(&local_58);
  execute_instruction(this,expected_regs_local._7_1_);
  local_20->f = 0xf0;
  local_20->pc = 3;
  verify_state_changes(this,local_20);
  pIVar3 = std::unique_ptr<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>::
           operator->(&this->cpu);
  local_bc = (*pIVar3->_vptr_ICpu[1])();
  local_c0 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_b8,"cpu->get_cycles_executed()","3",&local_bc,&local_c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  return;
}

Assistant:

void verify_ld_r16_d16(uint8_t instruction, ICpu::Registers& expected_regs) {
        regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

        EXPECT_CALL(mmu, read_word(regs.pc + 1)).WillOnce(Return(0x3344));
        execute_instruction(instruction);

        expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
        expected_regs.pc = 3;
        verify_state_changes(expected_regs);

        EXPECT_EQ(cpu->get_cycles_executed(), 3);
    }